

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdD3D56TexOffset::emulate_mthd(MthdD3D56TexOffset *this)

{
  byte *pbVar1;
  uint uVar2;
  
  uVar2 = this->which;
  if ((uVar2 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[0] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     5);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if ((uVar2 & 2) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[1] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 0x40;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (which & 1) {
			exp.misc32[0] = val;
			insrt(exp.valid[1], 14, 1, 1);
		}
		if (which & 2) {
			exp.misc32[1] = val;
			insrt(exp.valid[1], 22, 1, 1);
		}
	}